

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerGLSL::remove_duplicate_swizzle(CompilerGLSL *this,string *op)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  pointer pcVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_type i;
  size_type sVar9;
  ulong uVar10;
  string final_swiz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar6 = ::std::__cxx11::string::rfind((char)op,0x2e);
  if (uVar6 + 1 < 2) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)&final_swiz,(ulong)op);
  if ((this->backend).swizzle_is_function == true) {
    if (1 < final_swiz._M_string_length) {
      ::std::__cxx11::string::substr((ulong)&local_48,(ulong)&final_swiz);
      bVar5 = ::std::operator==(&local_48,"()");
      ::std::__cxx11::string::~string((string *)&local_48);
      if (bVar5) {
        ::std::__cxx11::string::erase((ulong)&final_swiz,final_swiz._M_string_length - 2);
        goto LAB_0025b6dd;
      }
    }
  }
  else {
LAB_0025b6dd:
    sVar9 = 0;
    while (final_swiz._M_string_length != sVar9) {
      if ((sVar9 == 4) ||
         (pcVar1 = final_swiz._M_dataplus._M_p + sVar9, pcVar2 = "xyzw" + sVar9, sVar9 = sVar9 + 1,
         *pcVar1 != *pcVar2)) goto LAB_0025b7ad;
    }
    lVar7 = ::std::__cxx11::string::rfind((char)op,0x2e);
    if (lVar7 != -1) {
      uVar8 = lVar7 + 1;
      pcVar4 = (op->_M_dataplus)._M_p;
      uVar10 = uVar8;
      goto LAB_0025b736;
    }
  }
LAB_0025b7ad:
  bVar5 = false;
LAB_0025b7af:
  ::std::__cxx11::string::~string((string *)&final_swiz);
  return bVar5;
LAB_0025b736:
  if (uVar6 <= uVar10) goto LAB_0025b774;
  cVar3 = pcVar4[uVar10];
  if ((byte)(cVar3 + 0x85U) < 0xfc) {
    bVar5 = false;
    if (((cVar3 != '(') || ((this->backend).swizzle_is_function == false)) || (uVar10 - uVar6 != -2)
       ) goto LAB_0025b7af;
    if (pcVar4[uVar10 + 1] != ')') goto LAB_0025b7ad;
    goto LAB_0025b774;
  }
  uVar10 = uVar10 + 1;
  goto LAB_0025b736;
LAB_0025b774:
  bVar5 = true;
  if ((final_swiz._M_string_length <= uVar6 - uVar8) &&
     (::std::__cxx11::string::erase((ulong)op,final_swiz._M_string_length + uVar8),
     (this->backend).swizzle_is_function == true)) {
    ::std::__cxx11::string::append((char *)op);
  }
  goto LAB_0025b7af;
}

Assistant:

bool CompilerGLSL::remove_duplicate_swizzle(string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto prevpos = op.find_last_of('.', pos - 1);
	if (prevpos == string::npos)
		return false;

	prevpos++;

	// Make sure there are only swizzles here ...
	for (auto i = prevpos; i < pos; i++)
	{
		if (op[i] < 'w' || op[i] > 'z')
		{
			// If swizzles are foo.xyz() like in C++ backend for example, check for that.
			if (backend.swizzle_is_function && i + 2 == pos && op[i] == '(' && op[i + 1] == ')')
				break;
			return false;
		}
	}

	// If original swizzle is large enough, just carve out the components we need.
	// E.g. foobar.wyx.xy will turn into foobar.wy.
	if (pos - prevpos >= final_swiz.size())
	{
		op.erase(prevpos + final_swiz.size(), string::npos);

		// Add back the function call ...
		if (backend.swizzle_is_function)
			op += "()";
	}
	return true;
}